

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void getLinearGradientValues(LinearGradientValues *v,QSpanData *data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  
  auVar2._0_8_ = *(double *)((long)&data->field_23 + 0x18) - *(double *)((long)&data->field_23 + 8);
  v->dx = auVar2._0_8_;
  dVar3 = *(double *)((long)&data->field_23 + 0x20) - *(double *)((long)&data->field_23 + 0x10);
  v->dy = dVar3;
  dVar4 = auVar2._0_8_ * auVar2._0_8_ + dVar3 * dVar3;
  v->l = dVar4;
  v->off = 0.0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    auVar2._8_8_ = dVar3;
    auVar1._8_8_ = dVar4;
    auVar1._0_8_ = dVar4;
    auVar2 = divpd(auVar2,auVar1);
    v->dx = (qreal)auVar2._0_8_;
    v->dy = (qreal)auVar2._8_8_;
    v->off = -auVar2._0_8_ * *(double *)((long)&data->field_23 + 8) -
             auVar2._8_8_ * *(double *)((long)&data->field_23 + 0x10);
  }
  return;
}

Assistant:

static void QT_FASTCALL getLinearGradientValues(LinearGradientValues *v, const QSpanData *data)
{
    v->dx = data->gradient.linear.end.x - data->gradient.linear.origin.x;
    v->dy = data->gradient.linear.end.y - data->gradient.linear.origin.y;
    v->l = v->dx * v->dx + v->dy * v->dy;
    v->off = 0;
    if (v->l != 0) {
        v->dx /= v->l;
        v->dy /= v->l;
        v->off = -v->dx * data->gradient.linear.origin.x - v->dy * data->gradient.linear.origin.y;
    }
}